

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(ExceptionTranslatorRegistry *this)

{
  ExceptionTranslatorRegistry *this_local;
  
  ~ExceptionTranslatorRegistry(this);
  operator_delete(this);
  return;
}

Assistant:

~ExceptionTranslatorRegistry() {
            deleteAll( m_translators );
        }